

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,
          StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void> *this,
          duration<long,_std::ratio<1L,_1000000000L>_> *duration)

{
  ReusableStringStream *pRVar1;
  char local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char local_45 [13];
  rep local_38;
  undefined1 local_30 [8];
  ReusableStringStream rss;
  duration<long,_std::ratio<1L,_1000000000L>_> *duration_local;
  
  rss.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  local_38 = clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                       ((duration<long,_std::ratio<1L,_1000000000L>_> *)rss.m_oss);
  pRVar1 = ReusableStringStream::operator<<((ReusableStringStream *)local_30,&local_38);
  local_45[0] = ' ';
  pRVar1 = ReusableStringStream::operator<<(pRVar1,local_45);
  ratio_string<std::ratio<1l,1000000000l>>::symbol_abi_cxx11_();
  pRVar1 = ReusableStringStream::operator<<(pRVar1,&local_68);
  local_69 = 's';
  ReusableStringStream::operator<<(pRVar1,&local_69);
  std::__cxx11::string::~string((string *)&local_68);
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_30);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(std::chrono::duration<Value, Ratio> const& duration) {
            ReusableStringStream rss;
            rss << duration.count() << ' ' << ratio_string<Ratio>::symbol() << 's';
            return rss.str();
        }